

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.h
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::RecordSet::RecordSet(RecordSet *this,RecordSet *param_1)

{
  KUINT16 KVar1;
  KUINT32 KVar2;
  RecordSet *param_1_local;
  RecordSet *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__RecordSet_0032f260;
  KVar1 = param_1->m_ui16RecCnt;
  this->m_ui16RecLen = param_1->m_ui16RecLen;
  this->m_ui16RecCnt = KVar1;
  KVar2 = param_1->m_ui32RecSetSerialNum;
  this->m_ui32RecID = param_1->m_ui32RecID;
  this->m_ui32RecSetSerialNum = KVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->m_vui8RecVals,&param_1->m_vui8RecVals);
  return;
}

Assistant:

class KDIS_EXPORT RecordSet : public DataTypeBase
{
protected:

    KUINT32 m_ui32RecID;

    KUINT32 m_ui32RecSetSerialNum;

    KUINT16 m_ui16RecLen;

    KUINT16 m_ui16RecCnt;

	std::vector<KUINT8> m_vui8RecVals;

public:

    static const KUINT16 RECORD_SET_SIZE = 12; // Min size

    RecordSet();

    RecordSet(KDataStream &stream) noexcept(false);

	RecordSet( KDIS::DATA_TYPE::ENUMS::RecordID ID, KUINT32 SerialNum, 
		       const std::vector<KUINT8> & RecordValue, KUINT16 RecordCount );

    virtual ~RecordSet();

    //************************************
    // FullName:    KDIS::DATA_TYPE::RecordSet::SetRecordID
    //              KDIS::DATA_TYPE::RecordSet::GetRecordID
    // Description: Specifies the data structure used to convey
    //              the parameters values of the record.
    // Parameter:   RecordID ID
    //************************************
    void SetRecordID( KDIS::DATA_TYPE::ENUMS::RecordID ID );
    KDIS::DATA_TYPE::ENUMS::RecordID GetRecordID() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RecordSet::SetSerialNumber
    //              KDIS::DATA_TYPE::RecordSet::GetSerialNumber
    // Description: Record serial number.
    // Parameter:   KUINT32 SN
    //************************************
    void SetSerialNumber( KUINT32 SN );
    KUINT32 GetSerialNumber() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RecordSet::GetRecordLength
    // Description: Specifies the total length in bytes/octets of the record set.
    //************************************
    KUINT16 GetRecordLength() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RecordSet::SetRecordCount
    //              KDIS::DATA_TYPE::RecordSet::GetRecordCount
    // Description: Specifies the number of bits used in the record.
    // Parameter:   KUINT16 RC, void
    //************************************
    void SetRecordCount( KUINT16 RC );
    KUINT16 GetRecordCount() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RecordSet::SetRecordValues
    //              KDIS::DATA_TYPE::RecordSet::GetRecordValues
    //              KDIS::DATA_TYPE::RecordSet::ClearRecordValues
    // Description: Contains the concatenated records of the format specified by the Record ID.
    //              You will need to set the record count, this is the number of bits in the
    //              record values parameter(RV) that are used.
    // Parameter:   vector<KUINT8> & RC, void
    // Parameter:   KUINT16 RecNt - Number of bits used by the record.
    //************************************
	void SetRecordValues( const std::vector<KUINT8> & RV, KUINT16 RecCnt );
	const std::vector<KUINT8> & GetRecordValues() const;
    void ClearRecordValues();

    //************************************
    // FullName:    KDIS::DATA_TYPE::RecordSet::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::RecordSet::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::RecordSet::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const RecordSet & Value ) const;
    KBOOL operator != ( const RecordSet & Value ) const;
}